

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int pk_parse_key_pkcs8_encrypted_der
              (mbedtls_pk_context *pk,uchar *key,size_t keylen,uchar *pwd,size_t pwdlen)

{
  int iVar1;
  uchar *end;
  size_t len;
  uchar *p;
  mbedtls_md_type_t md_alg;
  mbedtls_cipher_type_t cipher_alg;
  mbedtls_asn1_buf pbe_alg_oid;
  mbedtls_asn1_buf pbe_params;
  uchar buf [2048];
  ulong local_880;
  uchar *local_878;
  mbedtls_md_type_t local_870;
  mbedtls_cipher_type_t local_86c;
  mbedtls_asn1_buf local_868;
  mbedtls_asn1_buf local_850;
  uchar local_838 [2056];
  
  memset(local_838,0,0x800);
  if (pwdlen == 0) {
    return -0x3c00;
  }
  local_878 = key;
  iVar1 = mbedtls_asn1_get_tag(&local_878,key + keylen,&local_880,0x30);
  if (iVar1 != 0) {
LAB_001605d0:
    return iVar1 + -0x3d00;
  }
  end = local_878 + local_880;
  iVar1 = mbedtls_asn1_get_alg(&local_878,end,&local_868,&local_850);
  if ((iVar1 != 0) || (iVar1 = mbedtls_asn1_get_tag(&local_878,end,&local_880,4), iVar1 != 0))
  goto LAB_001605d0;
  if (0x800 < local_880) {
    return -16000;
  }
  iVar1 = mbedtls_oid_get_pkcs12_pbe_alg(&local_868,&local_870,&local_86c);
  if (iVar1 == 0) {
    iVar1 = mbedtls_pkcs12_pbe(&local_850,0,local_86c,local_870,pwd,pwdlen,local_878,local_880,
                               local_838);
    if (iVar1 == -0x1e00) {
      return -0x3b80;
    }
  }
  else {
    if (local_868.len != 9) {
      if (local_868.len != 10) {
        return -0x3980;
      }
      if ((short)*(long *)((long)local_868.p + 8) != 0x101 ||
          *(long *)local_868.p != 0xc010df78648862a) {
        return -0x3980;
      }
      iVar1 = mbedtls_pkcs12_pbe_sha1_rc4_128(&local_850,0,pwd,pwdlen,local_878,local_880,local_838)
      ;
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_838[0] != '0') {
        return -0x3b80;
      }
      goto LAB_001606f1;
    }
    if ((char)*(long *)((long)local_868.p + 8) != '\r' || *(long *)local_868.p != 0x5010df78648862a)
    {
      return -0x3980;
    }
    iVar1 = mbedtls_pkcs5_pbes2(&local_850,0,pwd,pwdlen,local_878,local_880,local_838);
    if (iVar1 == -0x2e00) {
      return -0x3b80;
    }
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_001606f1:
  iVar1 = pk_parse_key_pkcs8_unencrypted_der(pk,local_838,local_880);
  return iVar1;
}

Assistant:

static int pk_parse_key_pkcs8_encrypted_der(
                                    mbedtls_pk_context *pk,
                                    const unsigned char *key, size_t keylen,
                                    const unsigned char *pwd, size_t pwdlen )
{
    int ret, decrypted = 0;
    size_t len;
    unsigned char buf[2048];
    unsigned char *p, *end;
    mbedtls_asn1_buf pbe_alg_oid, pbe_params;
#if defined(MBEDTLS_PKCS12_C)
    mbedtls_cipher_type_t cipher_alg;
    mbedtls_md_type_t md_alg;
#endif

    memset( buf, 0, sizeof( buf ) );

    p = (unsigned char *) key;
    end = p + keylen;

    if( pwdlen == 0 )
        return( MBEDTLS_ERR_PK_PASSWORD_REQUIRED );

    /*
     * This function parses the EncryptedPrivatKeyInfo object (PKCS#8)
     *
     *  EncryptedPrivateKeyInfo ::= SEQUENCE {
     *    encryptionAlgorithm  EncryptionAlgorithmIdentifier,
     *    encryptedData        EncryptedData
     *  }
     *
     *  EncryptionAlgorithmIdentifier ::= AlgorithmIdentifier
     *
     *  EncryptedData ::= OCTET STRING
     *
     *  The EncryptedData OCTET STRING is a PKCS#8 PrivateKeyInfo
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_alg( &p, end, &pbe_alg_oid, &pbe_params ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( len > sizeof( buf ) )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    /*
     * Decrypt EncryptedData with appropriate PDE
     */
#if defined(MBEDTLS_PKCS12_C)
    if( mbedtls_oid_get_pkcs12_pbe_alg( &pbe_alg_oid, &md_alg, &cipher_alg ) == 0 )
    {
        if( ( ret = mbedtls_pkcs12_pbe( &pbe_params, MBEDTLS_PKCS12_PBE_DECRYPT,
                                cipher_alg, md_alg,
                                pwd, pwdlen, p, len, buf ) ) != 0 )
        {
            if( ret == MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH )
                return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

            return( ret );
        }

        decrypted = 1;
    }
    else if( MBEDTLS_OID_CMP( MBEDTLS_OID_PKCS12_PBE_SHA1_RC4_128, &pbe_alg_oid ) == 0 )
    {
        if( ( ret = mbedtls_pkcs12_pbe_sha1_rc4_128( &pbe_params,
                                             MBEDTLS_PKCS12_PBE_DECRYPT,
                                             pwd, pwdlen,
                                             p, len, buf ) ) != 0 )
        {
            return( ret );
        }

        // Best guess for password mismatch when using RC4. If first tag is
        // not MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE
        //
        if( *buf != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
            return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

        decrypted = 1;
    }
    else
#endif /* MBEDTLS_PKCS12_C */
#if defined(MBEDTLS_PKCS5_C)
    if( MBEDTLS_OID_CMP( MBEDTLS_OID_PKCS5_PBES2, &pbe_alg_oid ) == 0 )
    {
        if( ( ret = mbedtls_pkcs5_pbes2( &pbe_params, MBEDTLS_PKCS5_DECRYPT, pwd, pwdlen,
                                  p, len, buf ) ) != 0 )
        {
            if( ret == MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH )
                return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );

            return( ret );
        }

        decrypted = 1;
    }
    else
#endif /* MBEDTLS_PKCS5_C */
    {
        ((void) pwd);
    }

    if( decrypted == 0 )
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( pk_parse_key_pkcs8_unencrypted_der( pk, buf, len ) );
}